

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_api.c
# Opt level: O1

MPP_RET vp9d_init(void *ctx,ParserCfg *init)

{
  MPP_RET MVar1;
  void *data;
  
  if (ctx == (void *)0x0 || init == (ParserCfg *)0x0) {
    _mpp_log_l(2,"vp9d_api","vp9d init fail",(char *)0x0);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = vp9d_parser_init((Vp9CodecContext *)ctx,init);
    if ((MVar1 == MPP_OK) && (MVar1 = vp9d_split_init((Vp9CodecContext *)ctx), MVar1 == MPP_OK)) {
      data = mpp_osal_malloc("vp9d_init",0x80000);
      if (data == (void *)0x0) {
        _mpp_log_l(2,"vp9d_api","vp9 init malloc stream buffer fail",(char *)0x0);
        MVar1 = MPP_ERR_NOMEM;
      }
      else {
        MVar1 = mpp_packet_init((MppPacket *)((long)ctx + 0x30),data,0x80000);
        if (MVar1 == MPP_OK) {
          return MPP_OK;
        }
      }
    }
    vp9d_deinit(ctx);
  }
  return MVar1;
}

Assistant:

MPP_RET vp9d_init(void *ctx, ParserCfg *init)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *buf = NULL;
    RK_S32 size = SZ_512K;
    Vp9CodecContext *vp9_ctx = (Vp9CodecContext *)ctx;

    if (!vp9_ctx || !init) {
        mpp_err("vp9d init fail");
        return MPP_ERR_NULL_PTR;
    }

    if ((ret = vp9d_parser_init(vp9_ctx, init)) != MPP_OK)
        goto _err_exit;

    if ((ret = vp9d_split_init(vp9_ctx)) != MPP_OK)
        goto _err_exit;

    buf = mpp_malloc(RK_U8, size);
    if (!buf) {
        mpp_err("vp9 init malloc stream buffer fail");
        ret = MPP_ERR_NOMEM;
        goto _err_exit;
    }

    if ((ret = mpp_packet_init(&vp9_ctx->pkt, (void *)buf, size)) != MPP_OK)
        goto _err_exit;

    return ret;

_err_exit:
    vp9d_deinit(vp9_ctx);
    return ret;
}